

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O3

void load(item *x)

{
  long lVar1;
  int a;
  int iVar2;
  instrStruct *piVar3;
  int b;
  int op;
  
  iVar2 = x->mode;
  if (iVar2 == 0x2bd) {
    if (x->a == 0) {
      x->r = 0;
    }
    else {
      iVar2 = getReg();
      x->r = iVar2;
      put(0x10,iVar2,0,x->a);
    }
    goto LAB_0010856b;
  }
  if (iVar2 == 0x2c6) {
    if ((x->lev == 0) && (x->indLev == 0)) {
      x->a = x->a + RISC_MEMSIZE;
    }
    a = getReg();
    iVar2 = x->a;
    b = x->r;
    op = 0x33;
LAB_00108551:
    put(op,a,b,iVar2);
  }
  else {
    if (iVar2 != 0x2c1) goto LAB_0010856b;
    if (x->lev == 0) {
      x->a = x->a + RISC_MEMSIZE;
    }
    iVar2 = x->hs;
    a = getReg();
    if (iVar2 == 0) {
      iVar2 = x->a;
      b = x->r;
      op = 0x20;
      goto LAB_00108551;
    }
    iVar2 = x->hs;
    lVar1 = (long)bigNum;
    piVar3 = (instrStruct *)calloc(1,0x10);
    piVar3->instr = (iVar2 << 0x15 | (uint)(3 % lVar1)) + 0xa0000000;
    piVar3->next = lastInstr->next;
    lastInstr->next = piVar3;
    pc = pc + 1;
    lastInstr = piVar3;
    put(0x20,a,x->r,x->a);
    lVar1 = (long)bigNum;
    piVar3 = (instrStruct *)calloc(1,0x10);
    piVar3->instr = (uint)(2 % lVar1) | 0xa0000000;
    piVar3->next = lastInstr->next;
    lastInstr->next = piVar3;
    pc = pc + 1;
    lastInstr = piVar3;
    put(0x33,a,x->r,x->a);
    regs[x->hs] = 0;
  }
  regs[x->r] = 0;
  x->r = a;
LAB_0010856b:
  x->mode = 0x2c2;
  return;
}

Assistant:

procedure 
void load(struct item *x) {
	variable int r;
	r = 0;
	
	/* load items based on their stack addr. */
	if (x->mode == CLASS_VAR) {
		if (x->lev == 0) {
			x->a = RISC_MEMSIZE + x->a;
		}

		/* cases: */
		/* (i) R[x->hs] == 0 => load addr. from heap */
		/* (ii) R[x->hs] == 1 => load addr. from stack */
		if (x->hs != 0) {
			r = getReg();
			put(RISC_BEQ,x->hs,0,3); 
			put(RISC_LDW,r,x->r,x->a); 
			put(RISC_BEQ,0,0,2);
			put(RISC_HLDW,r,x->r,x->a); 
			regs[x->hs] = 0;

		/* simply load variable into R[r] */
		} else {
			r = getReg();
			put(RISC_LDW,r,x->r,x->a);
		}
		regs[x->r] = 0;
		x->r = r;

	 /* record elements reside on heap */
	} elsif (x->mode == CLASS_IND) {
		if ((x->lev == 0) && (x->indLev == 0)) {
			x->a = RISC_MEMSIZE + x->a;	
		}
		r = getReg();
		put(RISC_HLDW,r,x->r,x->a);
		regs[x->r] = 0;
		x->r = r;

	/* constant stuff can be stored into R[r] */
	} elsif (x->mode == CLASS_CONST) {
		if (x->a == 0) {
			x->r = 0;
		} else {
			r = getReg();
			x->r = r;
			put(RISC_ADDI,x->r,0,x->a);
		}
	}
	x->mode = CLASS_REG;
}